

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O2

void uS::Socket::ssl_io_cb<uWS::WebSocket<false>>(uv_poll_t *p,int status,int events)

{
  long *plVar1;
  long lVar2;
  SSL *s;
  undefined8 *puVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  undefined4 in_register_00000034;
  Socket SVar7;
  Socket local_38;
  
  SVar7.p._4_4_ = in_register_00000034;
  SVar7.p._0_4_ = status;
  if (status < 0) {
    uWS::WebSocket<false>::onEnd((WebSocket<false> *)p,SVar7);
    return;
  }
  plVar1 = (long *)p->data;
  lVar2 = *plVar1;
  s = (SSL *)plVar1[1];
  if ((plVar1[4] != 0) && (((events & 2U) != 0 || (iVar5 = SSL_want(s), iVar5 == 3)))) {
    local_38.p = p;
    cork(&local_38,1);
    do {
      while( true ) {
        puVar3 = (undefined8 *)plVar1[4];
        uVar6 = SSL_write((SSL *)plVar1[1],(void *)*puVar3,*(int *)(puVar3 + 1));
        if (puVar3[1] != (long)(int)uVar6) break;
        if ((code *)puVar3[3] != (code *)0x0) {
          (*(code *)puVar3[3])(p,puVar3[4],0,puVar3[5]);
        }
        SocketData::Queue::pop((Queue *)(plVar1 + 4));
        if (((Queue *)(plVar1 + 4))->head == (Message *)0x0) {
          if (((*(byte *)(plVar1 + 3) & 2) == 0) || (iVar5 = SSL_want((SSL *)plVar1[1]), iVar5 == 2)
             ) goto LAB_00117672;
          *(undefined4 *)(plVar1 + 3) = 1;
          uVar6 = 1;
          goto LAB_00117666;
        }
      }
    } while (0 < (int)uVar6);
    SVar7.p = (uv_poll_t *)(ulong)uVar6;
    iVar5 = SSL_get_error((SSL *)plVar1[1],uVar6);
    if (iVar5 != 2) {
      if (iVar5 != 3) goto LAB_0011770c;
      if ((*(uint *)(plVar1 + 3) & 2) == 0) {
        uVar6 = *(uint *)(plVar1 + 3) | 2;
        *(uint *)(plVar1 + 3) = uVar6;
LAB_00117666:
        uv_poll_start(p,uVar6,p->poll_cb);
      }
    }
LAB_00117672:
    local_38.p = p;
    cork(&local_38,0);
  }
  if ((events & 1U) != 0) {
    while (uVar6 = SSL_read(s,*(void **)(lVar2 + 8),*(int *)(lVar2 + 0x10)), 0 < (int)uVar6) {
      uWS::WebSocket<false>::onData((Socket)p,*(char **)(lVar2 + 8),uVar6);
      local_38.p = p;
      bVar4 = isClosed(&local_38);
      if (bVar4) {
        return;
      }
      if (*(char *)((long)p->data + 0x1c) != '\0') {
        return;
      }
      iVar5 = SSL_pending(s);
      if (iVar5 == 0) {
        return;
      }
    }
    SVar7.p = (uv_poll_t *)(ulong)uVar6;
    iVar5 = SSL_get_error(s,uVar6);
    if (iVar5 != 2) {
      if (iVar5 != 3) {
LAB_0011770c:
        uWS::WebSocket<false>::onEnd((WebSocket<false> *)p,SVar7);
        return;
      }
      if ((*(uint *)(plVar1 + 3) & 2) == 0) {
        uVar6 = *(uint *)(plVar1 + 3) | 2;
        *(uint *)(plVar1 + 3) = uVar6;
        uv_poll_start(p,uVar6,p->poll_cb);
      }
    }
  }
  return;
}

Assistant:

static void ssl_io_cb(uv_poll_t *p, int status, int events) {
        SocketData *socketData = Socket(p).getSocketData();
        NodeData *nodeData = socketData->nodeData;
        SSL *ssl = socketData->ssl;

        if (status < 0) {
            STATE::onEnd(p);
            return;
        }

        if (!socketData->messageQueue.empty() && ((events & UV_WRITABLE) || SSL_want(socketData->ssl) == SSL_READING)) {
            Socket(p).cork(true);
            while (true) {
                SocketData::Queue::Message *messagePtr = socketData->messageQueue.front();
                int sent = SSL_write(socketData->ssl, messagePtr->data, messagePtr->length);
                if (sent == (ssize_t) messagePtr->length) {
                    if (messagePtr->callback) {
                        messagePtr->callback(p, messagePtr->callbackData, false, messagePtr->reserved);
                    }
                    socketData->messageQueue.pop();
                    if (socketData->messageQueue.empty()) {
                        if ((socketData->poll & UV_WRITABLE) && SSL_want(socketData->ssl) != SSL_WRITING) {
                            // todo, remove bit, don't set directly
                            socketData->poll = UV_READABLE;
                            uv_poll_start(p, UV_READABLE, Socket(p).getPollCallback());
                        }
                        break;
                    }
                } else if (sent <= 0) {
                    switch (SSL_get_error(socketData->ssl, sent)) {
                    case SSL_ERROR_WANT_READ:
                        break;
                    case SSL_ERROR_WANT_WRITE:
                        if ((socketData->poll & UV_WRITABLE) == 0) {
                            socketData->poll |= UV_WRITABLE;
                            uv_poll_start(p, socketData->poll, Socket(p).getPollCallback());
                        }
                        break;
                    default:
                        STATE::onEnd(p);
                        return;
                    }
                    break;
                }
            }
            Socket(p).cork(false);
        }

        if (events & UV_READABLE) {
            do {
                int length = SSL_read(ssl, nodeData->recvBuffer, nodeData->recvLength);
                if (length <= 0) {
                    switch (SSL_get_error(ssl, length)) {
                    case SSL_ERROR_WANT_READ:
                        break;
                    case SSL_ERROR_WANT_WRITE:
                        if ((socketData->poll & UV_WRITABLE) == 0) {
                            socketData->poll |= UV_WRITABLE;
                            uv_poll_start(p, socketData->poll, Socket(p).getPollCallback());
                        }
                        break;
                    default:
                        STATE::onEnd(p);
                        return;
                    }
                    break;
                } else {
                    STATE::onData(p, nodeData->recvBuffer, length);
                    if (Socket(p).isClosed() || Socket(p).isShuttingDown()) {
                        return;
                    }
                }
            } while (SSL_pending(ssl));
        }
    }